

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 *cr_min,ImVec2 *cr_max,bool intersect_with_current_clip_rect)

{
  float fVar1;
  float fVar2;
  undefined3 in_register_00000009;
  uint uVar3;
  float fVar4;
  ImVec2 IVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 local_20;
  float fStack_18;
  float fStack_14;
  
  fVar8 = cr_max->x;
  fVar1 = cr_max->y;
  IVar5 = *cr_min;
  fVar4 = IVar5.y;
  fVar6 = fVar1;
  local_20 = IVar5;
  if (CONCAT31(in_register_00000009,intersect_with_current_clip_rect) != 0) {
    fVar6 = (this->_CmdHeader).ClipRect.x;
    fVar2 = (this->_CmdHeader).ClipRect.y;
    if (IVar5.x < fVar6) {
      local_20.y = fVar4;
      local_20.x = fVar6;
      IVar5.y = 0.0;
      IVar5.x = fVar6;
    }
    fVar7 = (this->_CmdHeader).ClipRect.z;
    fVar6 = (this->_CmdHeader).ClipRect.w;
    if (fVar4 < fVar2) {
      local_20.y = fVar2;
      fVar4 = fVar2;
    }
    if (fVar8 <= fVar7) {
      fVar7 = fVar8;
    }
    fVar8 = fVar7;
    if (fVar1 <= fVar6) {
      fVar6 = fVar1;
    }
  }
  uVar3 = -(uint)(fVar8 <= IVar5.x);
  fStack_18 = (float)(~uVar3 & (uint)fVar8 | (uint)IVar5.x & uVar3);
  fStack_14 = (float)(~-(uint)(fVar6 <= fVar4) & (uint)fVar6 | (uint)fVar4 & -(uint)(fVar6 <= fVar4)
                     );
  ImVector<ImVec4>::push_back(&this->_ClipRectStack,(ImVec4 *)&local_20);
  (this->_CmdHeader).ClipRect.x = local_20.x;
  (this->_CmdHeader).ClipRect.y = local_20.y;
  (this->_CmdHeader).ClipRect.z = fStack_18;
  (this->_CmdHeader).ClipRect.w = fStack_14;
  _OnChangedClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(const ImVec2& cr_min, const ImVec2& cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect)
    {
        ImVec4 current = _CmdHeader.ClipRect;
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    _CmdHeader.ClipRect = cr;
    _OnChangedClipRect();
}